

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

void google::protobuf::internal::OnShutdownRun(_func_void_void_ptr *f,void *arg)

{
  ShutdownData *this;
  MutexLock lock;
  MutexLock local_30;
  pair<void_(*)(const_void_*),_const_void_*> local_28;
  
  this = ShutdownData::get();
  local_30.mu_ = &this->mutex;
  absl::lts_20250127::Mutex::Lock(local_30.mu_);
  local_28.first = f;
  local_28.second = arg;
  std::
  vector<std::pair<void(*)(void_const*),void_const*>,std::allocator<std::pair<void(*)(void_const*),void_const*>>>
  ::emplace_back<std::pair<void(*)(void_const*),void_const*>>
            ((vector<std::pair<void(*)(void_const*),void_const*>,std::allocator<std::pair<void(*)(void_const*),void_const*>>>
              *)this,&local_28);
  absl::lts_20250127::MutexLock::~MutexLock(&local_30);
  return;
}

Assistant:

void OnShutdownRun(void (*f)(const void*), const void* arg) {
  auto shutdown_data = ShutdownData::get();
  absl::MutexLock lock(&shutdown_data->mutex);
  shutdown_data->functions.push_back(std::make_pair(f, arg));
}